

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O2

wchar_t Infoclr_Opcode(char *str)

{
  long lVar1;
  int iVar2;
  wchar_t wVar3;
  long lVar4;
  
  lVar1 = 0;
  do {
    lVar4 = lVar1;
    if (lVar4 + 0x10 == 0x130) {
      return L'\xffffffff';
    }
    iVar2 = strcmp(*(char **)((long)opcode_pairs + lVar4),str);
    lVar1 = lVar4 + 0x10;
  } while (iVar2 != 0);
  wVar3 = atoi(*(char **)((long)opcode_pairs + lVar4 + 8));
  return wVar3;
}

Assistant:

static int Infoclr_Opcode(const char *str)
{
	register int i;

	/* Scan through all legal operation names */
	for (i = 0; opcode_pairs[i * 2]; ++i) {
		/* Is this the right oprname? */
		if (streq(opcode_pairs[i * 2], str)) {
			/* Convert the second element in the pair into a Code */
			return (atoi(opcode_pairs[i * 2 + 1]));
		}
	}

	/* The code was not found, return -1 */
	return (-1);
}